

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

void __thiscall spvtools::opt::analysis::IntConstant::~IntConstant(IntConstant *this)

{
  pointer puVar1;
  
  (this->super_ScalarConstant).super_Constant._vptr_Constant =
       (_func_int **)&PTR__ScalarConstant_00b1c8b8;
  puVar1 = (this->super_ScalarConstant).words_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_ScalarConstant).words_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

IntConstant(const Integer* ty, const std::vector<uint32_t>& w)
      : ScalarConstant(ty, w) {}